

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_factory.cpp
# Opt level: O0

unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> __thiscall
n_e_s::core::RomFactory::from_bytes(RomFactory *this,istream *bytestream)

{
  allocator<unsigned_char> *this_00;
  pointer puVar1;
  long __n;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  size_t __n_00;
  size_type sVar5;
  invalid_argument *piVar6;
  reference pvVar7;
  long *plVar8;
  logic_error *this_01;
  v8 *this_02;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  string local_210;
  INesHeader local_1f0;
  INesHeader local_1e0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_198;
  undefined1 local_180 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> chr_memory;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_160;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_158;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_150;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_148;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_140;
  undefined1 local_138 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> prg_rom;
  uint32_t expected_rom_size;
  uint32_t chr_rom_byte_count;
  uint32_t prg_rom_byte_count;
  uint8_t mapper;
  uchar *local_108;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_100;
  undefined1 local_f4 [8];
  INesHeader h;
  allocator<unsigned_char> local_d1;
  undefined1 local_d0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  istream *bytestream_local;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
  *local_a8 [3];
  undefined1 local_90 [16];
  v8 *local_80;
  char *local_78;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> *local_70;
  char *local_68;
  undefined8 uStack_60;
  string *local_58;
  char **local_50;
  char *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> **local_38
  ;
  undefined1 *local_30;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> **local_28
  ;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char> **local_20
  ;
  undefined8 local_18;
  undefined1 *local_10;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)bytestream;
  __n_00 = anon_unknown.dwarf_1d4df2::streamsize(bytestream);
  std::allocator<unsigned_char>::allocator(&local_d1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,__n_00,&local_d1);
  std::allocator<unsigned_char>::~allocator(&local_d1);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  puVar1 = bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (sVar5 < 0x10) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"File isn\'t big enough to contain a header");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  plVar8 = (long *)std::istream::read((char *)puVar1,(long)pvVar7);
  bVar3 = std::ios::operator!((ios *)((long)plVar8 + *(long *)(*plVar8 + -0x18)));
  if ((bVar3 & 1) != 0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Unable to get bytes");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  INesHeader::INesHeader((INesHeader *)local_f4);
  local_100._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  _prg_rom_byte_count =
       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  local_108 = (uchar *)__gnu_cxx::
                       __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)&prg_rom_byte_count,4);
  bVar4 = std::
          equal<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*>
                    (local_100,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )local_108,(uchar *)local_f4);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"No valid iNes header");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,0);
  puVar1 = *(pointer *)pvVar7;
  h.nes[0] = pvVar7[8];
  h.nes[1] = pvVar7[9];
  h.nes[2] = pvVar7[10];
  h.nes[3] = pvVar7[0xb];
  h.prg_rom_size = pvVar7[0xc];
  h.chr_rom_size = pvVar7[0xd];
  h.flags_6 = pvVar7[0xe];
  h.flags_7 = pvVar7[0xf];
  if (h.nes[0] == '\0') {
    h.nes[0] = '\x01';
  }
  local_f4[6] = (byte)((ulong)puVar1 >> 0x30);
  local_f4[7] = (byte)((ulong)puVar1 >> 0x38);
  chr_rom_byte_count._3_1_ = (byte)((int)(uint)(local_f4[6] & 0xf0) >> 4) | local_f4[7] & 0xf0;
  local_f4[4] = (byte)((ulong)puVar1 >> 0x20);
  __n = (long)(int)((uint)local_f4[4] * 0x10) * 0x400;
  local_f4 = (undefined1  [8])puVar1;
  if ((int)__n != __n) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  local_f4[5] = (byte)((ulong)puVar1 >> 0x28);
  prg_rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)local_f4[5] * 0x2000;
  prg_rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ =
       (int)__n + 0x10 +
       prg_rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_;
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  if (sVar5 != (uint)prg_rom.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage) {
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Unexpected rom size");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_148._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  local_140 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_148,0x10);
  local_160._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  local_158 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_160,0x10);
  local_150 = __gnu_cxx::
              __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator+(&local_158,__n);
  this_00 = (allocator<unsigned_char> *)
            ((long)&chr_memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(this_00);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_138,local_140,local_150,
             this_00);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&chr_memory.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  if (local_f4[5] == '\0') {
    this_02 = (v8 *)0x2000;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,0x2000);
  }
  else {
    local_1b0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    local_1a8 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_1b0,0x10);
    local_1a0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_1a8,__n);
    local_1d0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
    local_1c8 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_1d0,0x10);
    local_1c0 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_1c8,__n);
    local_1b8 = __gnu_cxx::
                __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_1c0,
                            (ulong)prg_rom.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)(local_1e0.zeros + 4));
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_198,local_1a0,local_1b8
               ,(allocator<unsigned_char> *)(local_1e0.zeros + 4));
    this_02 = (v8 *)&local_198;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_198);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)(local_1e0.zeros + 4));
  }
  if (chr_rom_byte_count._3_1_ == 0) {
    std::
    make_unique<n_e_s::core::Nrom,n_e_s::core::INesHeader&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              (&local_1e0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f4,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
    std::unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>>::
    unique_ptr<n_e_s::core::Nrom,std::default_delete<n_e_s::core::Nrom>,void>
              ((unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>> *)this,
               (unique_ptr<n_e_s::core::Nrom,_std::default_delete<n_e_s::core::Nrom>_> *)&local_1e0)
    ;
    std::unique_ptr<n_e_s::core::Nrom,_std::default_delete<n_e_s::core::Nrom>_>::~unique_ptr
              ((unique_ptr<n_e_s::core::Nrom,_std::default_delete<n_e_s::core::Nrom>_> *)&local_1e0)
    ;
  }
  else {
    if (chr_rom_byte_count._3_1_ != 2) {
      this_01 = (logic_error *)__cxa_allocate_exception(0x10);
      local_58 = &local_210;
      local_68 = "Unsupported mapper: {}";
      uStack_60 = 0x16;
      local_70 = (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_unsigned_char>
                  *)((long)&chr_rom_byte_count + 3);
      local_50 = &local_68;
      local_80 = (v8 *)0x2c4f60;
      local_78 = (char *)0x16;
      local_48 = (char *)local_80;
      pcStack_40 = local_78;
      local_a8[0] = ::fmt::v8::
                    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,unsigned_char&>
                              (local_70,this_02,(uchar *)local_58);
      local_30 = local_90;
      local_38 = local_a8;
      local_18 = 2;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_38;
      fmt.size_ = 2;
      fmt.data_ = local_78;
      local_28 = local_38;
      local_20 = local_38;
      local_10 = local_30;
      ::fmt::v8::vformat_abi_cxx11_(&local_210,local_80,fmt,args);
      std::logic_error::logic_error(this_01,(string *)&local_210);
      __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    std::
    make_unique<n_e_s::core::Mapper2,n_e_s::core::INesHeader&,std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
              (&local_1f0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f4,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
    std::unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>>::
    unique_ptr<n_e_s::core::Mapper2,std::default_delete<n_e_s::core::Mapper2>,void>
              ((unique_ptr<n_e_s::core::IRom,std::default_delete<n_e_s::core::IRom>> *)this,
               (unique_ptr<n_e_s::core::Mapper2,_std::default_delete<n_e_s::core::Mapper2>_> *)
               &local_1f0);
    std::unique_ptr<n_e_s::core::Mapper2,_std::default_delete<n_e_s::core::Mapper2>_>::~unique_ptr
              ((unique_ptr<n_e_s::core::Mapper2,_std::default_delete<n_e_s::core::Mapper2>_> *)
               &local_1f0);
  }
  local_1f0.zeros[1] = '\x01';
  local_1f0.zeros[2] = '\0';
  local_1f0.zeros[3] = '\0';
  local_1f0.zeros[4] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_180);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_138);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0);
  return (__uniq_ptr_data<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>,_true,_true>)
         (__uniq_ptr_data<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<IRom> RomFactory::from_bytes(std::istream &bytestream) {
    std::vector<uint8_t> bytes(streamsize(bytestream));
    if (bytes.size() < 16) {
        throw std::invalid_argument(
                "File isn't big enough to contain a header");
    }

    if (!bytestream.read(reinterpret_cast<char *>(&bytes[0]), bytes.size())) {
        throw std::invalid_argument("Unable to get bytes");
    }

    INesHeader h;
    if (!std::equal(bytes.begin(), bytes.begin() + sizeof(h.nes), h.nes)) {
        throw std::invalid_argument("No valid iNes header");
    }

    // This is fine because the header is exactly 16 bytes with no padding.
    memcpy(&h, &bytes[0], sizeof(h));
    if (h.prg_ram_size == 0) {
        h.prg_ram_size = 1; // For compatibility reasons, 0 ram means 1 ram.
    }

    uint8_t mapper = static_cast<uint8_t>(h.flags_6 & 0xF0u) >> 4u;
    mapper |= h.flags_7 & 0xF0u;

    const auto prg_rom_byte_count =
            static_cast<uint32_t>(h.prg_rom_size * 16 * 1024);
    const auto chr_rom_byte_count =
            static_cast<uint32_t>(h.chr_rom_size * 8 * 1024);

    const uint32_t expected_rom_size =
            sizeof(INesHeader) + prg_rom_byte_count + chr_rom_byte_count;
    if (bytes.size() != expected_rom_size) {
        throw std::invalid_argument("Unexpected rom size");
    }

    std::vector<uint8_t> prg_rom(bytes.begin() + sizeof(INesHeader),
            bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count);

    std::vector<uint8_t> chr_memory;
    if (h.chr_rom_size == 0) {
        // No chr rom, game uses chr ram
        // Allocate ram with enough size:
        // https://www.nesdev.org/wiki/CHR_ROM_vs._CHR_RAM
        chr_memory.resize(static_cast<std::size_t>(8u * 1024u));
    } else {
        chr_memory = std::vector<uint8_t>(
                bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count,
                bytes.begin() + sizeof(INesHeader) + prg_rom_byte_count +
                        chr_rom_byte_count);
    }

    if (mapper == 0) {
        return std::make_unique<Nrom>(h, prg_rom, chr_memory);
    }
    if (mapper == 2) {
        return std::make_unique<Mapper2>(h, prg_rom, chr_memory);
    }

    throw std::logic_error(fmt::format("Unsupported mapper: {}", mapper));
}